

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

void strpool_internal_expand_hash_table(strpool_t *pool)

{
  int iVar1;
  uint uVar2;
  strpool_internal_hash_slot_t *ptr;
  uint uVar3;
  strpool_internal_hash_slot_t *psVar4;
  uint local_30;
  int slot;
  int base_slot;
  uint hash_key;
  int i;
  strpool_internal_hash_slot_t *old_table;
  int old_capacity;
  strpool_t *pool_local;
  
  iVar1 = pool->hash_capacity;
  ptr = pool->hash_table;
  pool->hash_capacity = pool->hash_capacity << 1;
  psVar4 = (strpool_internal_hash_slot_t *)
           sx__malloc((sx_alloc *)pool->memctx,(long)pool->hash_capacity * 0xc,0,(char *)0x0,
                      (char *)0x0,0);
  pool->hash_table = psVar4;
  if (pool->hash_table == (strpool_internal_hash_slot_t *)0x0) {
    __assert_fail("pool->hash_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x33c,"void strpool_internal_expand_hash_table(strpool_t *)");
  }
  memset(pool->hash_table,0,(long)pool->hash_capacity * 0xc);
  base_slot = 0;
  do {
    if (iVar1 <= base_slot) {
      sx__free((sx_alloc *)pool->memctx,ptr,0,(char *)0x0,(char *)0x0,0);
      return;
    }
    uVar2 = ptr[base_slot].hash_key;
    if (uVar2 != 0) {
      uVar3 = uVar2 & pool->hash_capacity - 1U;
      local_30 = uVar3;
      while (pool->hash_table[(int)local_30].hash_key != 0) {
        local_30 = local_30 + 1 & pool->hash_capacity - 1U;
      }
      if (uVar2 == 0) {
        __assert_fail("hash_key",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x348,"void strpool_internal_expand_hash_table(strpool_t *)");
      }
      pool->hash_table[(int)local_30].hash_key = uVar2;
      pool->hash_table[(int)local_30].entry_index = ptr[base_slot].entry_index;
      pool->entries[pool->hash_table[(int)local_30].entry_index].hash_slot = local_30;
      pool->hash_table[(int)uVar3].base_count = pool->hash_table[(int)uVar3].base_count + 1;
    }
    base_slot = base_slot + 1;
  } while( true );
}

Assistant:

static void strpool_internal_expand_hash_table( strpool_t* pool )
    {
    int old_capacity = pool->hash_capacity;
    strpool_internal_hash_slot_t* old_table = pool->hash_table;

    pool->hash_capacity *= 2;

    pool->hash_table = (strpool_internal_hash_slot_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->hash_capacity * sizeof( *pool->hash_table ) );
    STRPOOL_ASSERT( pool->hash_table );
    STRPOOL_MEMSET( pool->hash_table, 0, pool->hash_capacity * sizeof( *pool->hash_table ) );

    for( int i = 0; i < old_capacity; ++i )
        {
        STRPOOL_U32 hash_key = old_table[ i ].hash_key;
        if( hash_key )
            {
            int base_slot = (int)( hash_key & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
            int slot = base_slot;
            while( pool->hash_table[ slot ].hash_key )
                slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
            STRPOOL_ASSERT( hash_key );
            pool->hash_table[ slot ].hash_key = hash_key;
            pool->hash_table[ slot ].entry_index = old_table[ i ].entry_index;  
            pool->entries[ pool->hash_table[ slot ].entry_index ].hash_slot = slot; 
            ++pool->hash_table[ base_slot ].base_count;
            }               
        }

    STRPOOL_FREE( pool->memctx, old_table );
    }